

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode Curl_pin_peer_pubkey(Curl_easy *data,char *pinnedpubkey,uchar *pubkey,size_t pubkeylen)

{
  size_t sVar1;
  int iVar2;
  CURLcode CVar3;
  size_t sVar4;
  bool local_b1;
  FILE *pFStack_a0;
  CURLcode pem_read;
  size_t pem_len;
  size_t size;
  long filesize;
  uchar *sha256sumdigest;
  char *end_pos;
  char *begin_pos;
  char *pinkeycopy;
  char *encoded;
  size_t pinkeylen;
  size_t encodedlen;
  CURLcode encode;
  CURLcode result;
  uchar *pem_ptr;
  uchar *buf;
  FILE *fp;
  size_t pubkeylen_local;
  uchar *pubkey_local;
  char *pinnedpubkey_local;
  Curl_easy *data_local;
  
  pem_ptr = (uchar *)0x0;
  _encode = (uchar *)0x0;
  encodedlen._4_4_ = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
  if (pinnedpubkey == (char *)0x0) {
    data_local._4_4_ = CURLE_OK;
  }
  else if ((pubkey == (uchar *)0x0) || (pubkeylen == 0)) {
    data_local._4_4_ = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
  }
  else {
    fp = (FILE *)pubkeylen;
    pubkeylen_local = (size_t)pubkey;
    pubkey_local = (uchar *)pinnedpubkey;
    pinnedpubkey_local = (char *)data;
    iVar2 = strncmp(pinnedpubkey,"sha256//",8);
    if (iVar2 == 0) {
      if (Curl_ssl->sha256sum == (_func_CURLcode_uchar_ptr_size_t_uchar_ptr_size_t *)0x0) {
        data_local._4_4_ = encodedlen._4_4_;
      }
      else {
        filesize = (long)(*Curl_cmalloc)(0x20);
        if ((uchar *)filesize == (uchar *)0x0) {
          data_local._4_4_ = CURLE_OUT_OF_MEMORY;
        }
        else {
          encodedlen._0_4_ =
               (*Curl_ssl->sha256sum)((uchar *)pubkeylen_local,(size_t)fp,(uchar *)filesize,0x20);
          data_local._4_4_ = (CURLcode)encodedlen;
          if ((CURLcode)encodedlen == CURLE_OK) {
            encodedlen._0_4_ =
                 Curl_base64_encode((Curl_easy *)pinnedpubkey_local,(char *)filesize,0x20,
                                    &pinkeycopy,&pinkeylen);
            (*Curl_cfree)((void *)filesize);
            filesize = 0;
            if ((CURLcode)encodedlen == CURLE_OK) {
              Curl_infof((Curl_easy *)pinnedpubkey_local,"\t public key hash: sha256//%s\n",
                         pinkeycopy);
              sVar4 = strlen((char *)pubkey_local);
              encoded = (char *)(sVar4 + 1);
              begin_pos = (char *)(*Curl_cmalloc)((size_t)encoded);
              if (begin_pos == (char *)0x0) {
                (*Curl_cfree)(pinkeycopy);
                data_local._4_4_ = CURLE_OUT_OF_MEMORY;
              }
              else {
                memcpy(begin_pos,pubkey_local,(size_t)encoded);
                end_pos = begin_pos;
                do {
                  sha256sumdigest = (uchar *)strstr(end_pos,";sha256//");
                  sVar1 = pinkeylen;
                  if (sha256sumdigest != (uchar *)0x0) {
                    *sha256sumdigest = '\0';
                  }
                  sVar4 = strlen(end_pos + 8);
                  if ((sVar1 == sVar4) &&
                     (iVar2 = memcmp(pinkeycopy,end_pos + 8,pinkeylen), iVar2 == 0)) {
                    encodedlen._4_4_ = CURLE_OK;
                    break;
                  }
                  if (sha256sumdigest != (uchar *)0x0) {
                    *sha256sumdigest = ';';
                    end_pos = strstr((char *)sha256sumdigest,"sha256//");
                  }
                  local_b1 = sha256sumdigest != (uchar *)0x0 && end_pos != (char *)0x0;
                } while (local_b1);
                (*Curl_cfree)(pinkeycopy);
                pinkeycopy = (char *)0x0;
                (*Curl_cfree)(begin_pos);
                data_local._4_4_ = encodedlen._4_4_;
              }
            }
            else {
              data_local._4_4_ = (CURLcode)encodedlen;
            }
          }
        }
      }
    }
    else {
      buf = (uchar *)fopen64((char *)pubkey_local,"rb");
      if ((FILE *)buf == (FILE *)0x0) {
        data_local._4_4_ = encodedlen._4_4_;
      }
      else {
        iVar2 = fseek((FILE *)buf,0,2);
        if (iVar2 == 0) {
          size = ftell((FILE *)buf);
          iVar2 = fseek((FILE *)buf,0,0);
          if (((((iVar2 == 0) && (-1 < (long)size)) && ((long)size < 0x100001)) &&
              ((pem_len = curlx_sotouz(size), fp <= pem_len &&
               (pem_ptr = (uchar *)(*Curl_cmalloc)((size_t)((long)&((FILE *)pem_len)->_flags + 1)),
               pem_ptr != (uchar *)0x0)))) &&
             (sVar4 = fread(pem_ptr,pem_len,1,(FILE *)buf), (int)sVar4 == 1)) {
            if (fp == (FILE *)pem_len) {
              iVar2 = memcmp((void *)pubkeylen_local,pem_ptr,(size_t)fp);
              if (iVar2 == 0) {
                encodedlen._4_4_ = CURLE_OK;
              }
            }
            else {
              pem_ptr[pem_len] = '\0';
              CVar3 = pubkey_pem_to_der((char *)pem_ptr,(uchar **)&encode,
                                        (size_t *)&stack0xffffffffffffff60);
              if (((CVar3 == CURLE_OK) && (fp == pFStack_a0)) &&
                 (iVar2 = memcmp((void *)pubkeylen_local,_encode,(size_t)fp), iVar2 == 0)) {
                encodedlen._4_4_ = CURLE_OK;
              }
            }
          }
        }
        (*Curl_cfree)(pem_ptr);
        pem_ptr = (uchar *)0x0;
        (*Curl_cfree)(_encode);
        _encode = (uchar *)0x0;
        fclose((FILE *)buf);
        data_local._4_4_ = encodedlen._4_4_;
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_pin_peer_pubkey(struct Curl_easy *data,
                              const char *pinnedpubkey,
                              const unsigned char *pubkey, size_t pubkeylen)
{
  FILE *fp;
  unsigned char *buf = NULL, *pem_ptr = NULL;
  CURLcode result = CURLE_SSL_PINNEDPUBKEYNOTMATCH;

  /* if a path wasn't specified, don't pin */
  if(!pinnedpubkey)
    return CURLE_OK;
  if(!pubkey || !pubkeylen)
    return result;

  /* only do this if pinnedpubkey starts with "sha256//", length 8 */
  if(strncmp(pinnedpubkey, "sha256//", 8) == 0) {
    CURLcode encode;
    size_t encodedlen, pinkeylen;
    char *encoded, *pinkeycopy, *begin_pos, *end_pos;
    unsigned char *sha256sumdigest;

    if(!Curl_ssl->sha256sum) {
      /* without sha256 support, this cannot match */
      return result;
    }

    /* compute sha256sum of public key */
    sha256sumdigest = malloc(CURL_SHA256_DIGEST_LENGTH);
    if(!sha256sumdigest)
      return CURLE_OUT_OF_MEMORY;
    encode = Curl_ssl->sha256sum(pubkey, pubkeylen,
                        sha256sumdigest, CURL_SHA256_DIGEST_LENGTH);

    if(encode != CURLE_OK)
      return encode;

    encode = Curl_base64_encode(data, (char *)sha256sumdigest,
                                CURL_SHA256_DIGEST_LENGTH, &encoded,
                                &encodedlen);
    Curl_safefree(sha256sumdigest);

    if(encode)
      return encode;

    infof(data, "\t public key hash: sha256//%s\n", encoded);

    /* it starts with sha256//, copy so we can modify it */
    pinkeylen = strlen(pinnedpubkey) + 1;
    pinkeycopy = malloc(pinkeylen);
    if(!pinkeycopy) {
      Curl_safefree(encoded);
      return CURLE_OUT_OF_MEMORY;
    }
    memcpy(pinkeycopy, pinnedpubkey, pinkeylen);
    /* point begin_pos to the copy, and start extracting keys */
    begin_pos = pinkeycopy;
    do {
      end_pos = strstr(begin_pos, ";sha256//");
      /*
       * if there is an end_pos, null terminate,
       * otherwise it'll go to the end of the original string
       */
      if(end_pos)
        end_pos[0] = '\0';

      /* compare base64 sha256 digests, 8 is the length of "sha256//" */
      if(encodedlen == strlen(begin_pos + 8) &&
         !memcmp(encoded, begin_pos + 8, encodedlen)) {
        result = CURLE_OK;
        break;
      }

      /*
       * change back the null-terminator we changed earlier,
       * and look for next begin
       */
      if(end_pos) {
        end_pos[0] = ';';
        begin_pos = strstr(end_pos, "sha256//");
      }
    } while(end_pos && begin_pos);
    Curl_safefree(encoded);
    Curl_safefree(pinkeycopy);
    return result;
  }

  fp = fopen(pinnedpubkey, "rb");
  if(!fp)
    return result;

  do {
    long filesize;
    size_t size, pem_len;
    CURLcode pem_read;

    /* Determine the file's size */
    if(fseek(fp, 0, SEEK_END))
      break;
    filesize = ftell(fp);
    if(fseek(fp, 0, SEEK_SET))
      break;
    if(filesize < 0 || filesize > MAX_PINNED_PUBKEY_SIZE)
      break;

    /*
     * if the size of our certificate is bigger than the file
     * size then it can't match
     */
    size = curlx_sotouz((curl_off_t) filesize);
    if(pubkeylen > size)
      break;

    /*
     * Allocate buffer for the pinned key
     * With 1 additional byte for null terminator in case of PEM key
     */
    buf = malloc(size + 1);
    if(!buf)
      break;

    /* Returns number of elements read, which should be 1 */
    if((int) fread(buf, size, 1, fp) != 1)
      break;

    /* If the sizes are the same, it can't be base64 encoded, must be der */
    if(pubkeylen == size) {
      if(!memcmp(pubkey, buf, pubkeylen))
        result = CURLE_OK;
      break;
    }

    /*
     * Otherwise we will assume it's PEM and try to decode it
     * after placing null terminator
     */
    buf[size] = '\0';
    pem_read = pubkey_pem_to_der((const char *)buf, &pem_ptr, &pem_len);
    /* if it wasn't read successfully, exit */
    if(pem_read)
      break;

    /*
     * if the size of our certificate doesn't match the size of
     * the decoded file, they can't be the same, otherwise compare
     */
    if(pubkeylen == pem_len && !memcmp(pubkey, pem_ptr, pubkeylen))
      result = CURLE_OK;
  } while(0);

  Curl_safefree(buf);
  Curl_safefree(pem_ptr);
  fclose(fp);

  return result;
}